

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  byte *pbVar1;
  sqlite3 *db;
  char *zDatabase;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Table *pTVar5;
  Index *pIVar6;
  byte *__s1;
  tRowcnt tVar7;
  analysisInfo *pInfo;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (((argv != (char **)0x0) && (*argv != (char *)0x0)) &&
     (__s1 = (byte *)argv[2], __s1 != (byte *)0x0)) {
    db = *pData;
    zDatabase = *(char **)((long)pData + 8);
    pTVar5 = sqlite3FindTable(db,*argv,zDatabase);
    if (pTVar5 != (Table *)0x0) {
      bVar2 = true;
      if ((argv[1] == (char *)0x0) ||
         (pIVar6 = sqlite3FindIndex(db,argv[1],zDatabase), pIVar6 == (Index *)0x0)) {
        pIVar6 = (Index *)0x0;
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)pIVar6->nColumn;
        bVar2 = false;
      }
      bVar3 = *__s1;
      if (bVar3 != 0) {
        uVar8 = 0;
        while( true ) {
          tVar7 = 0;
          while ((byte)(bVar3 - 0x30) < 10) {
            tVar7 = ((uint)bVar3 + tVar7 * 10) - 0x30;
            pbVar1 = __s1 + 1;
            __s1 = __s1 + 1;
            bVar3 = *pbVar1;
          }
          if (uVar8 == 0) {
            pTVar5->nRowEst = tVar7;
          }
          if (bVar2) {
            return 0;
          }
          pIVar6->aiRowEst[uVar8] = tVar7;
          __s1 = __s1 + (*__s1 == 0x20);
          iVar4 = strcmp((char *)__s1,"unordered");
          if (iVar4 == 0) break;
          bVar3 = *__s1;
          if (bVar3 == 0) {
            return 0;
          }
          bVar10 = uVar9 <= uVar8;
          uVar8 = uVar8 + 1;
          if (bVar10) {
            return 0;
          }
        }
        pIVar6->field_0x4f = pIVar6->field_0x4f | 4;
      }
    }
  }
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  int i, c, n;
  tRowcnt v;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1] ){
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }else{
    pIndex = 0;
  }
  n = pIndex ? pIndex->nColumn : 0;
  z = argv[2];
  for(i=0; *z && i<=n; i++){
    v = 0;
    while( (c=z[0])>='0' && c<='9' ){
      v = v*10 + c - '0';
      z++;
    }
    if( i==0 ) pTable->nRowEst = v;
    if( pIndex==0 ) break;
    pIndex->aiRowEst[i] = v;
    if( *z==' ' ) z++;
    if( strcmp(z, "unordered")==0 ){
      pIndex->bUnordered = 1;
      break;
    }
  }
  return 0;
}